

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int ParseEXRMultipartHeaderFromMemory
              (EXRHeader ***exr_headers,int *num_headers,EXRVersion *exr_version,uchar *memory,
              size_t size,char **err)

{
  undefined4 in_EAX;
  int iVar1;
  EXRHeader **ppEVar2;
  EXRHeader *exr_header;
  pointer pHVar3;
  uchar *buf;
  long lVar4;
  size_t i;
  ulong uVar5;
  pointer pHVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  bool empty_header;
  allocator<char> local_131;
  char **local_130;
  string err_str;
  vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> infos;
  HeaderInfo info;
  string local_50;
  
  auVar8._0_4_ = -(uint)(exr_headers == (EXRHeader ***)0x0);
  auVar8._4_4_ = -(uint)(memory == (uchar *)0x0);
  auVar8._8_4_ = -(uint)(num_headers == (int *)0x0);
  auVar8._12_4_ = -(uint)(exr_version == (EXRVersion *)0x0);
  iVar1 = movmskps(in_EAX,auVar8);
  if (iVar1 == 0) {
    if (size < 8) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&info,"Data size too short",(allocator<char> *)&err_str);
      tinyexr::SetErrorMessage((string *)&info,err);
      std::__cxx11::string::~string((string *)&info);
      iVar1 = -4;
    }
    else {
      buf = memory + 8;
      infos.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      infos.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      infos.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_130 = err;
      while( true ) {
        info.attributes.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        info.attributes.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        info.channels.
        super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        info.attributes.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        info.channels.
        super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        info.channels.
        super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        tinyexr::HeaderInfo::clear(&info);
        err_str._M_dataplus._M_p = (pointer)&err_str.field_2;
        err_str._M_string_length = 0;
        err_str.field_2._M_local_buf[0] = '\0';
        empty_header = false;
        iVar1 = tinyexr::ParseEXRHeader(&info,&empty_header,exr_version,&err_str,buf,size - 8);
        if (iVar1 != 0) break;
        if (empty_header != false) {
          std::__cxx11::string::~string((string *)&err_str);
          tinyexr::HeaderInfo::~HeaderInfo(&info);
          pHVar6 = infos.
                   super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pHVar3 = infos.
                   super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          ppEVar2 = (EXRHeader **)
                    malloc((long)infos.
                                 super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)infos.
                                 super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4);
          *exr_headers = ppEVar2;
          lVar4 = 0;
          for (uVar5 = 0; uVar7 = (long)pHVar6 - (long)pHVar3 >> 7, uVar5 < uVar7; uVar5 = uVar5 + 1
              ) {
            exr_header = (EXRHeader *)malloc(0x88);
            tinyexr::ConvertHeader
                      (exr_header,(HeaderInfo *)((long)pHVar3->data_window + lVar4 + -0x30));
            exr_header->tiled = exr_version->tiled;
            (*exr_headers)[uVar5] = exr_header;
            lVar4 = lVar4 + 0x80;
            pHVar3 = infos.
                     super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pHVar6 = infos.
                     super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          }
          *num_headers = (int)uVar7;
          iVar1 = 0;
          goto LAB_00132d4b;
        }
        if (info.chunk_count == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"`chunkCount\' attribute is not found in the header.",
                     &local_131);
          tinyexr::SetErrorMessage(&local_50,local_130);
          std::__cxx11::string::~string((string *)&local_50);
          iVar1 = -4;
          goto LAB_00132d37;
        }
        std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::push_back
                  (&infos,&info);
        buf = buf + info.header_len;
        std::__cxx11::string::~string((string *)&err_str);
        tinyexr::HeaderInfo::~HeaderInfo(&info);
      }
      tinyexr::SetErrorMessage(&err_str,local_130);
LAB_00132d37:
      std::__cxx11::string::~string((string *)&err_str);
      tinyexr::HeaderInfo::~HeaderInfo(&info);
LAB_00132d4b:
      std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::~vector(&infos);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&info,"Invalid argument for ParseEXRMultipartHeaderFromMemory",
               (allocator<char> *)&err_str);
    tinyexr::SetErrorMessage((string *)&info,err);
    std::__cxx11::string::~string((string *)&info);
    iVar1 = -3;
  }
  return iVar1;
}

Assistant:

int ParseEXRMultipartHeaderFromMemory(EXRHeader ***exr_headers,
                                      int *num_headers,
                                      const EXRVersion *exr_version,
                                      const unsigned char *memory, size_t size,
                                      const char **err) {
  if (memory == NULL || exr_headers == NULL || num_headers == NULL ||
      exr_version == NULL) {
    // Invalid argument
    tinyexr::SetErrorMessage(
        "Invalid argument for ParseEXRMultipartHeaderFromMemory", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (size < tinyexr::kEXRVersionSize) {
    tinyexr::SetErrorMessage("Data size too short", err);
    return TINYEXR_ERROR_INVALID_DATA;
  }

  const unsigned char *marker = memory + tinyexr::kEXRVersionSize;
  size_t marker_size = size - tinyexr::kEXRVersionSize;

  std::vector<tinyexr::HeaderInfo> infos;

  for (;;) {
    tinyexr::HeaderInfo info;
    info.clear();

    std::string err_str;
    bool empty_header = false;
    int ret = ParseEXRHeader(&info, &empty_header, exr_version, &err_str,
                             marker, marker_size);

    if (ret != TINYEXR_SUCCESS) {
      tinyexr::SetErrorMessage(err_str, err);
      return ret;
    }

    if (empty_header) {
      marker += 1;  // skip '\0'
      break;
    }

    // `chunkCount` must exist in the header.
    if (info.chunk_count == 0) {
      tinyexr::SetErrorMessage(
          "`chunkCount' attribute is not found in the header.", err);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    infos.push_back(info);

    // move to next header.
    marker += info.header_len;
    size -= info.header_len;
  }

  // allocate memory for EXRHeader and create array of EXRHeader pointers.
  (*exr_headers) =
      static_cast<EXRHeader **>(malloc(sizeof(EXRHeader *) * infos.size()));
  for (size_t i = 0; i < infos.size(); i++) {
    EXRHeader *exr_header = static_cast<EXRHeader *>(malloc(sizeof(EXRHeader)));

    ConvertHeader(exr_header, infos[i]);

    // transfoer `tiled` from version.
    exr_header->tiled = exr_version->tiled;

    (*exr_headers)[i] = exr_header;
  }

  (*num_headers) = static_cast<int>(infos.size());

  return TINYEXR_SUCCESS;
}